

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  ParsedIR *this_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_01;
  uint32_t *ts_2;
  uint32_t *ts_2_00;
  Types TVar1;
  StorageClass SVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  Variant *pVVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  uint uVar11;
  ExecutionModel EVar12;
  SPIREntryPoint *pSVar13;
  SPIRConstant *constant;
  SPIRUndef *pSVar14;
  SPIRConstantOp *constant_00;
  SPIRType *pSVar15;
  uint *puVar16;
  SPIRVariable *pSVar17;
  mapped_type *pmVar18;
  ulong uVar19;
  runtime_error *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  BaseType BVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  char *pcVar22;
  ID *__k;
  byte bVar23;
  char *pcVar24;
  long lVar25;
  bool bVar26;
  LoopLock loop_lock;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  char *storage;
  SpecializationConstant local_1288;
  string local_1280;
  SpecializationConstant local_1260;
  SpecializationConstant local_1258;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1250;
  undefined1 local_1248 [24];
  char local_1230 [264];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  pSVar13 = Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x3d])(this);
  if (pSVar13->model == ExecutionModelFragment) {
    uVar11 = 0x81;
    if ((this->options).es != false) {
      uVar11 = 299;
    }
    if ((this->options).version <= uVar11) {
      replace_fragment_outputs(this);
    }
  }
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    emit_pls(this);
  }
  EVar12 = pSVar13->model;
  if ((EVar12 - ExecutionModelTessellationControl < 3) || (EVar12 == ExecutionModelMeshEXT)) {
    fixup_implicit_builtin_block_names(this,EVar12);
  }
  if ((this->super_Compiler).position_invariant == true) {
    bVar26 = true;
    if ((this->options).es == false) {
      bVar26 = 0x77 < (this->options).version;
    }
  }
  else {
    bVar26 = false;
  }
  if (((this->options).separate_shader_objects == true) && ((this->options).es == false)) {
    EVar12 = pSVar13->model;
    if ((int)EVar12 < 4) {
      if (EVar12 - ExecutionModelTessellationControl < 3) {
        emit_declared_builtin_block(this,Input,EVar12);
        goto LAB_002bfd4b;
      }
      if (EVar12 != ExecutionModelVertex) goto LAB_002bfd61;
    }
    else {
      if (EVar12 == ExecutionModelFragment) goto LAB_002bfced;
      if (EVar12 != ExecutionModelMeshEXT) goto LAB_002bfd61;
    }
  }
  else {
LAB_002bfced:
    bVar7 = should_force_emit_builtin_block(this,Output);
    if (!bVar7) {
      if (pSVar13->geometry_passthrough == true) {
        emit_declared_builtin_block(this,Input,pSVar13->model);
      }
      else {
        local_1128._0_8_ = "out";
        if (pSVar13->model == ExecutionModelFragment) {
          local_1128._0_8_ = "in";
        }
        ts_2 = &(this->super_Compiler).clip_distance_count;
        if ((this->super_Compiler).clip_distance_count != 0) {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,(char **)local_1128,(char (*) [24])0x3ab7b5,ts_2,(char (*) [3])0x390237);
        }
        ts_2_00 = &(this->super_Compiler).cull_distance_count;
        if ((this->super_Compiler).cull_distance_count != 0) {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,(char **)local_1128,(char (*) [24])0x3ab7ce,ts_2_00,(char (*) [3])0x390237
                    );
        }
        if (*ts_2_00 != 0 || *ts_2 != 0) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x35ca19);
        }
      }
      goto LAB_002bfd61;
    }
LAB_002bfd4b:
    EVar12 = pSVar13->model;
  }
  emit_declared_builtin_block(this,Output,EVar12);
  bVar26 = false;
LAB_002bfd61:
  if (bVar26) {
    statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
    statement<char_const(&)[1]>(this,(char (*) [1])0x35ca19);
  }
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 == 0) {
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_1288);
  }
  else {
    pTVar4 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar25 = 0;
    bVar26 = false;
    do {
      pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      pVVar5 = (Variant *)(&pbVar20->_M_dataplus + (ulong)*(uint *)((long)&pTVar4->id + lVar25) * 3)
      ;
      TVar1 = pVVar5->type;
      if ((int)TVar1 < 9) {
        if (TVar1 == TypeType) {
          pSVar15 = Variant::get<spirv_cross::SPIRType>(pVVar5);
          bVar7 = false;
          if ((pSVar15->basetype == Struct) &&
             ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
            if ((pSVar15->pointer != false) ||
               (bVar7 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,Block
                                  ), bVar7)) {
              bVar7 = false;
            }
            else {
              bVar7 = Compiler::has_decoration
                                (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,
                                 BufferBlock);
              bVar7 = !bVar7;
            }
          }
          if ((((pSVar15->basetype == Struct) && (pSVar15->pointer == true)) &&
              (bVar8 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,Block)
              , bVar8)) &&
             ((uVar11 = pSVar15->storage - RayPayloadKHR, uVar11 < 5 &&
              ((0x13U >> (uVar11 & 0x1f) & 1) != 0)))) {
            pSVar15 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_Compiler).ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (pSVar15->parent_type).id);
            bVar7 = true;
          }
          if (bVar7) {
            if (bVar26) {
              statement<char_const(&)[1]>(this,(char (*) [1])0x35ca19);
            }
            emit_struct(this,pSVar15);
            bVar26 = false;
          }
        }
        else if (TVar1 == TypeConstant) {
          constant = Variant::get<spirv_cross::SPIRConstant>(pVVar5);
          if ((constant->specialization != false) || ((constant->is_used_as_lut & 1U) != 0)) {
            if ((constant->specialization != false) && ((this->options).vulkan_semantics == false))
            {
              uVar10 = Compiler::get_decoration
                                 (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,
                                  DecorationSpecId);
              local_1248._0_4_ = uVar10;
              join<char_const(&)[25],unsigned_int&>
                        ((string *)local_1128,(spirv_cross *)"SPIRV_CROSS_CONSTANT_ID_",
                         (char (*) [25])local_1248,(uint *)pbVar20);
              ::std::__cxx11::string::operator=
                        ((string *)&constant->specialization_constant_macro_name,
                         (string *)local_1128);
              if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
                operator_delete((void *)local_1128._0_8_);
              }
            }
            bVar26 = true;
            emit_constant(this,constant);
          }
        }
      }
      else if (TVar1 == TypeConstantOp) {
        constant_00 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar5);
        bVar26 = true;
        emit_specialization_constant_op(this,constant_00);
      }
      else if (TVar1 == TypeUndef) {
        pSVar14 = Variant::get<spirv_cross::SPIRUndef>(pVVar5);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar14->super_IVariant).field_0xc);
        if ((pSVar15->basetype != Void) &&
           (bVar7 = Compiler::type_is_top_level_block(&this->super_Compiler,pSVar15), !bVar7)) {
          local_1128._0_8_ = local_1128 + 0x10;
          local_1128._8_8_ = 0;
          local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
          if (((this->options).force_zero_initialized_variables == true) &&
             (bVar26 = type_can_zero_initialize(this,pSVar15), bVar26)) {
            (*(this->super_Compiler)._vptr_Compiler[0x3b])
                      (&local_1280,this,(ulong)*(uint *)&(pSVar14->super_IVariant).field_0xc);
            join<char_const(&)[4],std::__cxx11::string>
                      ((string *)local_1248,(spirv_cross *)0x3a613c,(char (*) [4])&local_1280,
                       pbVar20);
            ::std::__cxx11::string::operator=((string *)local_1128,(string *)local_1248);
            if ((undefined1 *)local_1248._0_8_ != local_1248 + 0x10) {
              operator_delete((void *)local_1248._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
              operator_delete(local_1280._M_dataplus._M_p);
            }
          }
          (*(this->super_Compiler)._vptr_Compiler[6])
                    (&local_1280,this,(ulong)(pSVar14->super_IVariant).self.id,1);
          (*(this->super_Compiler)._vptr_Compiler[0x1b])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248
                     ,this,pSVar15,&local_1280,(ulong)(pSVar14->super_IVariant).self.id);
          statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128
                     ,(char (*) [2])0x3a5fd0);
          if ((undefined1 *)local_1248._0_8_ != local_1248 + 0x10) {
            operator_delete((void *)local_1248._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
            operator_delete(local_1280._M_dataplus._M_p);
          }
          if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
            operator_delete((void *)local_1128._0_8_);
          }
          bVar26 = true;
        }
      }
      lVar25 = lVar25 + 4;
    } while (sVar3 << 2 != lVar25);
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_1288);
    if (bVar26) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x35ca19);
    }
  }
  if (((pSVar13->model == ExecutionModelGLCompute) && ((this->options).vulkan_semantics == false))
     && (((pSVar13->workgroup_size).constant != 0 || (((pSVar13->flags).lower & 0x4000000000) != 0))
        )) {
    local_1288.id.id = 0;
    local_1258.id.id = 0;
    local_1260.id.id = 0;
    Compiler::get_work_group_size_specialization_constants
              (&this->super_Compiler,&local_1288,&local_1258,&local_1260);
    if (((local_1288.id.id != 0) || (local_1258.id.id != 0)) || (local_1260.id.id != 0)) {
      local_1248._0_8_ = local_1230;
      local_1248._8_8_ = 0;
      local_1248._16_8_ = 8;
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1248,&local_1288,&local_1258,&local_1260);
      local_110 = local_f8;
      local_1128._0_8_ = (char *)0x0;
      local_1128._8_8_ = 0;
      local_1128._16_8_ = 0;
      sStack_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1248._8_8_ != 0) {
        pcVar24 = (char *)(local_1248._0_8_ + local_1248._8_8_ * 0x20);
        pcVar22 = (char *)local_1248._0_8_;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,*(char **)pcVar22,
                     *(size_t *)(pcVar22 + 8));
          if (pcVar22 != (char *)(local_1248._0_8_ + local_1248._8_8_ * 0x20 + -0x20)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          pcVar22 = pcVar22 + 0x20;
        } while (pcVar22 != pcVar24);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1280,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",&local_1280,(char (*) [6])0x3a9d1d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
        operator_delete(local_1280._M_dataplus._M_p);
      }
      statement<char_const(&)[1]>(this,(char (*) [1])0x35ca19);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1248);
    }
  }
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    ParsedIR::create_loop_hard_lock(this_00);
    sVar3 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar3 != 0) {
      pTVar4 = (this->super_Compiler).ir.ids_for_type[1].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar25 = 0;
      do {
        uVar11 = *(uint *)((long)&pTVar4->id + lVar25);
        pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar5[uVar11].type == TypeType) {
          pSVar15 = Variant::get<spirv_cross::SPIRType>(pVVar5 + uVar11);
          local_1248._0_4_ = uVar11;
          bVar26 = Compiler::is_physical_pointer(&this->super_Compiler,pSVar15);
          if ((bVar26) &&
             ((bVar26 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar15)
              , bVar26 ||
              (puVar16 = (this->super_Compiler).physical_storage_non_block_pointer_types.
                         super_VectorView<unsigned_int>.ptr,
              puVar16 = ::std::
                        __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                  (puVar16,puVar16 + (this->super_Compiler).
                                                     physical_storage_non_block_pointer_types.
                                                     super_VectorView<unsigned_int>.buffer_size,
                                   local_1248),
              puVar16 !=
              (this->super_Compiler).physical_storage_non_block_pointer_types.
              super_VectorView<unsigned_int>.ptr +
              (this->super_Compiler).physical_storage_non_block_pointer_types.
              super_VectorView<unsigned_int>.buffer_size)))) {
            emit_buffer_reference_block(this,local_1248._0_4_,true);
          }
        }
        lVar25 = lVar25 + 4;
      } while (sVar3 << 2 != lVar25);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
    sVar3 = (this->super_Compiler).physical_storage_non_block_pointer_types.
            super_VectorView<unsigned_int>.buffer_size;
    if (sVar3 != 0) {
      puVar16 = (this->super_Compiler).physical_storage_non_block_pointer_types.
                super_VectorView<unsigned_int>.ptr;
      lVar25 = 0;
      do {
        emit_buffer_reference_block(this,*(uint32_t *)((long)puVar16 + lVar25),false);
        lVar25 = lVar25 + 4;
      } while (sVar3 << 2 != lVar25);
    }
    ParsedIR::create_loop_hard_lock(this_00);
    sVar3 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar3 != 0) {
      pTVar4 = (this->super_Compiler).ir.ids_for_type[1].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar25 = 0;
      do {
        uVar11 = *(uint *)((long)&pTVar4->id + lVar25);
        pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar5[uVar11].type == TypeType) {
          pSVar15 = Variant::get<spirv_cross::SPIRType>(pVVar5 + uVar11);
          bVar26 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar15);
          if (bVar26) {
            emit_buffer_reference_block(this,uVar11,false);
          }
        }
        lVar25 = lVar25 + 4;
      } while (sVar3 << 2 != lVar25);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  }
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar4 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    this_01 = &(this->super_Compiler).ir.meta;
    lVar25 = 0;
    do {
      uVar11 = *(uint *)((long)&pTVar4->id + lVar25);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar17 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar17->super_IVariant).field_0xc);
        SVar2 = pSVar15->storage;
        bVar23 = 1;
        if (((SVar2 != StorageClassUniform) && (SVar2 != StorageBuffer)) &&
           (SVar2 != ShaderRecordBufferKHR)) {
          bVar23 = 0;
        }
        __k = &(pSVar15->super_IVariant).self;
        pmVar18 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,__k);
        if (((pmVar18->decoration).decoration_flags.lower & 4) == 0) {
          pmVar18 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_01,__k);
          bVar26 = ((pmVar18->decoration).decoration_flags.lower & 8) == 0;
        }
        else {
          bVar26 = false;
        }
        if (((pSVar17->storage != Function) && ((bVar23 & pSVar15->pointer) != 0)) &&
           (bVar7 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false),
           !bVar26 && !bVar7)) {
          (*(this->super_Compiler)._vptr_Compiler[0x21])(this,pSVar17);
        }
      }
      lVar25 = lVar25 + 4;
    } while (sVar3 << 2 != lVar25);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar4 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar25 = 0;
    do {
      uVar11 = *(uint *)((long)&pTVar4->id + lVar25);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar17 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar17->super_IVariant).field_0xc);
        if (((pSVar17->storage != Function) && (pSVar15->pointer == true)) &&
           ((pSVar15->storage == PushConstant &&
            (bVar26 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false), !bVar26))))
        {
          (*(this->super_Compiler)._vptr_Compiler[0x22])(this,pSVar17);
        }
      }
      lVar25 = lVar25 + 4;
    } while (sVar3 << 2 != lVar25);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  sVar3 = (this->super_Compiler).combined_image_samplers.
          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
  bVar26 = (this->options).vulkan_semantics;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar6 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar6 == 0) {
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  }
  else {
    pTVar4 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar25 = 0;
    bVar7 = false;
    do {
      uVar11 = *(uint *)((long)&pTVar4->id + lVar25);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar17 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar17->super_IVariant).field_0xc);
        if ((((sVar3 == 0 & bVar26) != 0) ||
            (BVar21 = pSVar15->basetype ^ Image,
            (pSVar15->image).dim == Buffer && BVar21 == Unknown ||
            pSVar15->basetype != Sampler && ((pSVar15->image).sampled != 1 || BVar21 != Unknown)))
           && ((pSVar17->storage != Function && (pSVar15->pointer == true)))) {
          SVar2 = pSVar15->storage;
          if (((((SVar2 - CallableDataKHR < 0xf) &&
                ((0x4c03U >> (SVar2 - CallableDataKHR & 0x1f) & 1) != 0)) ||
               (SVar2 == AtomicCounter)) || (SVar2 == StorageClassUniformConstant)) &&
             (bVar8 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false), !bVar8)) {
            bVar7 = true;
            (*(this->super_Compiler)._vptr_Compiler[0x23])(this,pSVar17);
          }
        }
      }
      lVar25 = lVar25 + 4;
    } while (sVar6 << 2 != lVar25);
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
    if (bVar7) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x35ca19);
    }
  }
  ParsedIR::create_loop_hard_lock(this_00);
  sVar3 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 == 0) {
    bVar26 = false;
  }
  else {
    pTVar4 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar25 = 0;
    bVar7 = false;
    bVar26 = false;
    do {
      uVar11 = *(uint *)((long)&pTVar4->id + lVar25);
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar11].type == TypeVariable) {
        pSVar17 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar11);
        pSVar15 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar17->super_IVariant).field_0xc);
        bVar8 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false);
        if (pSVar17->storage == Output) {
          uVar11 = 0x81;
          if ((this->options).es != false) {
            uVar11 = 299;
          }
          if (uVar11 < (this->options).version) {
            uVar10 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar17->super_IVariant).self.id,
                                DecorationLocation);
            bVar9 = location_is_framebuffer_fetch(this,uVar10);
            bVar8 = bVar8 && !bVar9;
          }
        }
        if (((pSVar17->storage == Function) || (pSVar15->pointer != true)) ||
           (((pSVar17->storage | StorageClassUniform) != Output ||
            (bVar9 = Compiler::interface_variable_exists_in_entry_point
                               (&this->super_Compiler,(pSVar17->super_IVariant).self.id),
            bVar8 != false || !bVar9)))) {
          bVar8 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar17);
          if ((bVar8) &&
             (uVar10 = Compiler::get_decoration
                                 (&this->super_Compiler,(ID)(pSVar17->super_IVariant).self.id,
                                  BuiltIn), (this->options).vulkan_semantics == false)) {
            if ((bVar7) ||
               ((uVar10 != 0x1149 &&
                ((uVar10 == 0x2b & (this->options).vertex.support_nonzero_base_instance) == 0)))) {
              if (uVar10 == 0x114a) {
                statement<char_const(&)[38]>
                          (this,(char (*) [38])"#ifndef GL_ARB_shader_draw_parameters");
                statement<char_const(&)[55]>
                          (this,(char (*) [55])
                                "#error GL_ARB_shader_draw_parameters is not supported.");
              }
              else {
                if (uVar10 != 0x1148) goto LAB_002c0a15;
                statement<char_const(&)[37]>
                          (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
                statement<char_const(&)[48]>
                          (this,(char (*) [48])"#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
                statement<char_const(&)[6]>(this,(char (*) [6])"#else");
                statement<char_const(&)[36]>
                          (this,(char (*) [36])"uniform int SPIRV_Cross_BaseVertex;");
              }
              statement<char_const(&)[7]>(this,(char (*) [7])0x35ccfb);
            }
            else {
              statement<char_const(&)[37]>
                        (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[52]>
                        (this,(char (*) [52])"#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
              statement<char_const(&)[6]>(this,(char (*) [6])"#else");
              statement<char_const(&)[38]>
                        (this,(char (*) [38])"uniform int SPIRV_Cross_BaseInstance;");
              bVar7 = true;
              statement<char_const(&)[7]>(this,(char (*) [7])0x35ccfb);
              bVar26 = true;
            }
          }
        }
        else {
          if ((((this->options).es == true) &&
              (EVar12 = Compiler::get_execution_model(&this->super_Compiler),
              EVar12 == ExecutionModelVertex)) &&
             ((pSVar17->storage == Input &&
              ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 1)))) {
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (this_02,"OpenGL ES doesn\'t support array input variables in vertex shader.")
            ;
            *(undefined ***)this_02 = &PTR__runtime_error_0049deb0;
            __cxa_throw(this_02,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar26 = true;
          emit_interface_block(this,pSVar17);
        }
      }
LAB_002c0a15:
      lVar25 = lVar25 + 4;
    } while (sVar3 << 2 != lVar25);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  sVar3 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
  if (sVar3 != 0) {
    puVar16 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
    local_1250 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    lVar25 = 0;
    do {
      pSVar17 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + *(uint *)((long)puVar16 + lVar25));
      bVar7 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,true);
      if (!bVar7) {
        if (pSVar17->storage == Output) {
          uVar19 = (ulong)(pSVar17->initializer).id;
          if (((uVar19 != 0) &&
              (uVar19 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                        buffer_size)) &&
             (pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar5[uVar19].type == TypeConstant)) {
            Variant::get<spirv_cross::SPIRConstant>(pVVar5 + uVar19);
            emit_output_variable_initializer(this,pSVar17);
          }
        }
        else {
          bVar7 = variable_is_lut(this,pSVar17);
          if (!bVar7) {
            local_1128._0_4_ = (pSVar17->super_IVariant).self.id;
            pmVar18 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_1250,(key_type *)local_1128);
            add_variable(this,&this->resource_names,&this->block_names,(string *)pmVar18);
            local_1128._0_8_ = local_1128 + 0x10;
            local_1128._8_8_ = 0;
            local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
            if (((((this->options).force_zero_initialized_variables == true) &&
                 (pSVar17->storage == Private)) && ((pSVar17->initializer).id == 0)) &&
               ((pSVar17->static_expression).id == 0)) {
              pSVar15 = Compiler::get_variable_data_type(&this->super_Compiler,pSVar17);
              bVar26 = type_can_zero_initialize(this,pSVar15);
              if (bVar26) {
                uVar10 = Compiler::get_variable_data_type_id(&this->super_Compiler,pSVar17);
                pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (this->super_Compiler)._vptr_Compiler;
                (**(code **)((long)&pbVar20[0xe].field_2 + 8))(&local_1280,this,uVar10);
                join<char_const(&)[4],std::__cxx11::string>
                          ((string *)local_1248,(spirv_cross *)0x3a613c,(char (*) [4])&local_1280,
                           pbVar20);
                ::std::__cxx11::string::operator=((string *)local_1128,(string *)local_1248);
                if ((undefined1 *)local_1248._0_8_ != local_1248 + 0x10) {
                  operator_delete((void *)local_1248._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
                  operator_delete(local_1280._M_dataplus._M_p);
                }
              }
            }
            (*(this->super_Compiler)._vptr_Compiler[0x28])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1248,this,pSVar17);
            statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1128,(char (*) [2])0x3a5fd0);
            if ((undefined1 *)local_1248._0_8_ != local_1248 + 0x10) {
              operator_delete((void *)local_1248._0_8_);
            }
            if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
              operator_delete((void *)local_1128._0_8_);
            }
            bVar26 = true;
          }
        }
      }
      lVar25 = lVar25 + 4;
    } while (sVar3 << 2 != lVar25);
  }
  if (bVar26) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x35ca19);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	bool global_invariant_position = position_invariant && (options.es || options.version >= 120);

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
		global_invariant_position = false;
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (global_invariant_position)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_undef_or_type)
		{
			auto &id = ir.ids[id_];

			// Skip declaring any bogus constants or undefs which use block types.
			// We don't declare block types directly, so this will never work.
			// Should not be legal SPIR-V, so this is considered a workaround.

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
			else if (id.get_type() == TypeUndef)
			{
				auto &undef = id.get<SPIRUndef>();
				auto &type = this->get<SPIRType>(undef.basetype);
				// OpUndef can be void for some reason ...
				if (type.basetype == SPIRType::Void)
					continue;

				// This will break. It is bogus and should not be legal.
				if (type_is_top_level_block(type))
					continue;

				string initializer;
				if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
					initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

				// FIXME: If used in a constant, we must declare it as one.
				statement(variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
				emitted = true;
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer(type))
			{
				bool emit_type = true;
				if (!is_physical_pointer_to_buffer_block(type))
				{
					// Only forward-declare if we intend to emit it in the non_block_pointer types.
					// Otherwise, these are just "benign" pointer types that exist as a result of access chains.
					emit_type = std::find(physical_storage_non_block_pointer_types.begin(),
					                      physical_storage_non_block_pointer_types.end(),
					                      id) != physical_storage_non_block_pointer_types.end();
				}

				if (emit_type)
					emit_buffer_reference_block(id, true);
			}
		});

		for (auto type : physical_storage_non_block_pointer_types)
			emit_buffer_reference_block(type, false);

		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer_to_buffer_block(type))
				emit_buffer_reference_block(id, false);
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");
}